

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean read_restart_marker(j_decompress_ptr cinfo)

{
  boolean bVar1;
  int iVar2;
  long *in_RDI;
  boolean local_4;
  
  if ((*(int *)((long)in_RDI + 0x21c) == 0) && (bVar1 = next_marker(cinfo), bVar1 == 0)) {
    local_4 = 0;
  }
  else {
    if (*(int *)((long)in_RDI + 0x21c) == *(int *)(in_RDI[0x49] + 0x20) + 0xd0) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x62;
      *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)(in_RDI[0x49] + 0x20);
      (**(code **)(*in_RDI + 8))(in_RDI,3);
      *(undefined4 *)((long)in_RDI + 0x21c) = 0;
    }
    else {
      iVar2 = (**(code **)(in_RDI[5] + 0x28))(in_RDI,*(undefined4 *)(in_RDI[0x49] + 0x20));
      if (iVar2 == 0) {
        return 0;
      }
    }
    *(uint *)(in_RDI[0x49] + 0x20) = *(int *)(in_RDI[0x49] + 0x20) + 1U & 7;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

METHODDEF(boolean)
read_restart_marker(j_decompress_ptr cinfo)
{
  /* Obtain a marker unless we already did. */
  /* Note that next_marker will complain if it skips any data. */
  if (cinfo->unread_marker == 0) {
    if (!next_marker(cinfo))
      return FALSE;
  }

  if (cinfo->unread_marker ==
      ((int)M_RST0 + cinfo->marker->next_restart_num)) {
    /* Normal case --- swallow the marker and let entropy decoder continue */
    TRACEMS1(cinfo, 3, JTRC_RST, cinfo->marker->next_restart_num);
    cinfo->unread_marker = 0;
  } else {
    /* Uh-oh, the restart markers have been messed up. */
    /* Let the data source manager determine how to resync. */
    if (!(*cinfo->src->resync_to_restart) (cinfo,
                                           cinfo->marker->next_restart_num))
      return FALSE;
  }

  /* Update next-restart state */
  cinfo->marker->next_restart_num = (cinfo->marker->next_restart_num + 1) & 7;

  return TRUE;
}